

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

uint8_t get_target(tgestate_t *state,route_t *route,mappos8_t **doormappos,pos8_t **location)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  *doormappos = (mappos8_t *)0x0;
  *location = (pos8_t *)0x0;
  bVar3 = route->index;
  bVar2 = route->step;
  if (bVar3 == 0xff) {
    bVar3 = random_nibble(state);
    bVar2 = bVar3 & 7 | bVar2 & 0xf8;
    route->step = bVar2;
  }
  else {
    if (bVar2 == 0xff) {
      return 0xff;
    }
    if ((char)(bVar3 & 0x7f) == '\0') {
      bVar2 = 0x2f;
    }
    else {
      bVar1 = get_route::routes[bVar3 & 0x7f][bVar2];
      if (bVar1 == 0xff) {
        return 0xff;
      }
      bVar2 = bVar1 & 0x7f;
      if (bVar2 < 0x28) {
        *doormappos = &doors[(ulong)(byte)((bVar3 ^ bVar1) >> 7) + (ulong)(bVar1 & 0x7f) * 2].mappos
        ;
        return 0x80;
      }
    }
    bVar2 = bVar2 - 0x28;
  }
  *location = get_target::locations + bVar2;
  return '\0';
}

Assistant:

uint8_t get_target(tgestate_t       *state,
                   route_t          *route,
                   const mappos8_t **doormappos,
                   const pos8_t    **location)
{
  /**
   * $783A: Table of map locations used in routes.
   */
  static const pos8_t locations[78] =
  {
    // reset_visible_character guard dogs 1 & 2 use 0..7
    // character_behaviour uss this range also, for dog behaviour
    {  68, 104 }, // 0
    {  68,  84 }, // 1
    {  68,  70 }, // 2
    {  64, 102 }, // 3
    {  64,  64 }, // 4
    {  68,  68 }, // 5
    {  64,  64 }, // 6
    {  68,  64 }, // 7

    // charevnt_wander_top uses 8..15
    { 104, 112 }, // 8
    {  96, 112 }, // 9 used by route_guard_12_roll_call
    { 106, 102 }, // 10
    {  93, 104 }, // 11 used by route_commandant, route_exit_hut2, route_77E1, route_guard_13_roll_call, route_guard_13_bed, route_guard_14_bed, route_guard_15_bed
    { 124, 101 }, // 12 used by route_exit_hut2, route_77E7, route_77EC, route_guard_13_bed, route_guard_14_bed, route_guard_15_bed
    { 124, 112 }, // 13
    { 116, 104 }, // 14 used by route_exit_hut3, route_go_to_solitary, route_hero_leave_solitary
    { 112, 100 }, // 15

    // charevnt_wander_left uses 16..23
    { 120,  96 }, // 16 used by route_77EC
    { 128,  88 }, // 17 used by route_guard_14_roll_call
    { 112,  96 }, // 18
    { 116,  84 }, // 19
    { 124, 100 }, // 20
    { 124, 112 }, // 21
    { 116, 104 }, // 22
    { 112, 100 }, // 23

    // reset_visible_character guard dogs 3 & 4 use 24..31
    { 102,  68 }, // 24
    { 102,  64 }, // 25
    {  96,  64 }, // 26
    {  92,  68 }, // 27
    {  86,  68 }, // 28
    {  84,  64 }, // 29
    {  74,  68 }, // 30
    {  74,  64 }, // 31

    { 102,  68 }, // 32 used by route_7795
    {  68,  68 }, // 33 used by route_7795
    {  68, 104 }, // 34 used by route_7795

    { 107,  69 }, // 35 used by route_7799
    { 107,  45 }, // 36 used by route_7799
    {  77,  45 }, // 37 used by route_7799
    {  77,  61 }, // 38 used by route_7799
    {  61,  61 }, // 39 used by route_7799
    {  61, 103 }, // 40 used by route_7799

    { 116,  76 }, // 41
    {  44,  42 }, // 42 used by route_commandant, route_go_to_solitary
    { 106,  72 }, // 43 used by route_77CD
    { 110,  72 }, // 44 used by route_77CD
    {  81, 104 }, // 45 used by route_commandant, route_exit_hut3, route_guard_14_bed, route_guard_15_bed

    {  52,  60 }, // 46 used by route_commandant, route_prisoner_sleeps_1
    {  52,  44 }, // 47 used by route_prisoner_sleeps_2
    {  52,  28 }, // 48 used by route_prisoner_sleeps_3
    { 119, 107 }, // 49 used by route_guard_15_roll_call
    { 122, 110 }, // 50 used by route_hero_roll_call
    {  52,  28 }, // 51
    {  40,  60 }, // 52 used by route_77DE, route_guard_14_bed
    {  36,  34 }, // 53 used by route_77DE, route_guard_13_bed, route_guard_15_bed
    {  80,  76 }, // 54
    {  89,  76 }, // 55 used by route_commandant, route_77E1

    // charevnt_wander_yard uses 56..63
    {  89,  60 }, // 56 used by route_77E1
    { 100,  61 }, // 57
    {  92,  54 }, // 58
    {  84,  50 }, // 59
    { 102,  48 }, // 60 used by route_commandant
    {  96,  56 }, // 61
    {  79,  59 }, // 62
    { 103,  47 }, // 63

    {  52,  54 }, // 64 character walks into breakfast room, used by route_prisoner_sits_1
    {  52,  46 }, // 65 used by route_prisoner_sits_2
    {  52,  36 }, // 66 used by route_prisoner_sits_3
    {  52,  62 }, // 67 used by route_7833
    {  32,  56 }, // 68 used by route_guardA_breakfast
    {  52,  24 }, // 69 used by route_guardB_breakfast
    {  42,  46 }, // 70 used by route_hut2_right_to_left
    {  34,  34 }, // 71
    { 120, 110 }, // 72 roll call used by route_prisoner_1_roll_call
    { 118, 110 }, // 73 roll call used by route_prisoner_2_roll_call
    { 116, 110 }, // 74 roll call used by route_prisoner_3_roll_call
    { 121, 109 }, // 75 roll call used by route_prisoner_4_roll_call
    { 119, 109 }, // 76 roll call used by route_prisoner_5_roll_call
    { 117, 109 }, // 77 roll call used by route_prisoner_6_roll_call
  };

  uint8_t        routeindex; /* was A */
  uint8_t        index;      /* was A */
  uint8_t        step;       /* was A or C */
  const uint8_t *routebytes; /* was DE */
  uint8_t        routebyte;  /* was A */
  const door_t  *door;       /* was HL */

  assert(state     != NULL);
  assert(route     != NULL);
  ASSERT_ROUTE_VALID(*route);

  *doormappos  = NULL; /* Conv: Added. */
  *location = NULL; /* Conv: Added. */

#ifdef DEBUG_ROUTES
  printf("get_target(route.index=%d, route.step=%d)\n", route->index, route->step);
#endif

  routeindex = route->index;
  if (routeindex == routeindex_255_WANDER)
  {
    /* Wander around randomly. */
    /* Uses .step + rand(0..7) to index locations[]. */

    /* Randomise the bottom 3 bits of route->step. */
    /* Conv: In the original code *HL is used as a temporary. */
    index = route->step & ~7;
    index |= random_nibble(state) & 7; /* Conv: ADD became OR. */
    route->step = index;
  }
  else
  {
    step = route->step;

    /* Control can arrive here with routeindex set to zero. This happens when
     * the hero stands up during breakfast, is pursued by guards, then when
     * left to idle sits down and the pursuing guards resume their original
     * positions. get_route() will return in that case a NULL routebytes
     * pointer. This is not a conversion issue but happens even in the
     * original game where it starts fetching from $0001. In the Spectrum ROM
     * location $0001 holds XOR A ($AF).
     */

    routebytes = get_route(routeindex);

    if (step == 255)
    {
      /* Conv: Original code was relying on being able to fetch the preceding
       * route's final byte (255) in all cases. That's not going to work with
       * the way routes are defined in the portable version of the game so
       * instead just set routebyte to 255 here. */
      routebyte = routebyte_END;
    }
    else
    {
      /* Conv: If routebytes is NULL then mimic the ROM fetch bug. */
      if (routebytes == NULL)
        routebyte = 0xAF; /* location 7 + door_REVERSE (nonsensical) */
      else
        routebyte = routebytes[step]; // HL was temporary
    }

    if (routebyte == routebyte_END)
      /* Route byte == 255: End of route */
      return get_target_ROUTE_ENDS; /* Conv: Was a goto to a return. */

    routebyte &= ~door_REVERSE;
    if (routebyte < 40) // (0..39 || 128..167)
    {
      /* Route byte < 40: A door */
      routebyte = routebytes[step];
      if (route->index & ROUTEINDEX_REVERSE_FLAG)
        routebyte ^= door_REVERSE;
      door = get_door(routebyte);
      *doormappos = &door->mappos;
      return get_target_DOOR;
    }
    else
    {
      /* Route byte == 40..117: A location index */
      assert(routebyte >= 40);
      assert(routebyte <= 117);
      index = routebyte - 40;
    }
  }

  assert(index < NELEMS(locations));

  *location = &locations[index];

  return get_target_LOCATION;
}